

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseFulfillerPair<int> * kj::newPromiseAndFulfiller<int>(void)

{
  AdapterPromiseNode<int,_kj::_::PromiseAndFulfillerAdapter<int>_> *pAVar1;
  PromiseFulfillerPair<int> *in_RDI;
  Own<kj::_::WeakFulfiller<int>_> wrapper;
  Own<kj::_::WeakFulfiller<int>_> local_48;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::AdapterPromiseNode<int,_kj::_::PromiseAndFulfillerAdapter<int>_>_> local_28;
  
  _::WeakFulfiller<int>::make();
  heap<kj::_::AdapterPromiseNode<int,kj::_::PromiseAndFulfillerAdapter<int>>,kj::_::WeakFulfiller<int>&>
            ((kj *)&local_28,local_48.ptr);
  pAVar1 = local_28.ptr;
  local_38.disposer = local_28.disposer;
  local_28.ptr = (AdapterPromiseNode<int,_kj::_::PromiseAndFulfillerAdapter<int>_> *)0x0;
  Own<kj::_::AdapterPromiseNode<int,_kj::_::PromiseAndFulfillerAdapter<int>_>_>::dispose(&local_28);
  local_38.ptr = (PromiseNode *)0x0;
  (in_RDI->promise).super_PromiseBase.node.disposer = local_28.disposer;
  (in_RDI->promise).super_PromiseBase.node.ptr = (PromiseNode *)pAVar1;
  local_28.ptr = (AdapterPromiseNode<int,_kj::_::PromiseAndFulfillerAdapter<int>_> *)0x0;
  (in_RDI->fulfiller).disposer = local_48.disposer;
  (in_RDI->fulfiller).ptr = &(local_48.ptr)->super_PromiseFulfiller<int>;
  local_48.ptr = (WeakFulfiller<int> *)0x0;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_28);
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::WeakFulfiller<int>_>::dispose(&local_48);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}